

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.c
# Opt level: O1

int remap(KEYMAP *curmap,int c,PF funct,KEYMAP *pref_map)

{
  short sVar1;
  short sVar2;
  KCHAR KVar3;
  map_element *pmVar4;
  PF *pp_Var5;
  keymap_s *pkVar6;
  PF p_Var7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  short sVar12;
  long lVar13;
  map_element *pmVar14;
  long lVar15;
  int iVar16;
  bool bVar17;
  
  pmVar14 = ele;
  sVar1 = curmap->map_num;
  sVar12 = (short)c;
  if ((ele < curmap->map_element + sVar1) && (iVar11 = c - ele->k_base, ele->k_base <= c)) {
    pp_Var5 = ele->k_funcp;
    uVar9 = (ulong)iVar11;
    if (pp_Var5[uVar9] == funct) {
      if (pref_map == (KEYMAP *)0x0 || funct != (PF)0x0) {
        return 1;
      }
      if (ele->k_prefmap == pref_map) {
        return 1;
      }
    }
    if ((funct == (PF)0x0) && (ele->k_prefmap != (keymap_s *)0x0)) {
      if (iVar11 < 1) {
        uVar8 = 1;
        bVar17 = false;
      }
      else {
        uVar10 = 1;
        do {
          lVar13 = uVar10 - 1;
          if (pp_Var5[lVar13] == (PF)0x0) break;
          bVar17 = uVar10 < uVar9;
          uVar10 = uVar10 + 1;
        } while (bVar17);
        bVar17 = pp_Var5[lVar13] == (PF)0x0;
        uVar8 = (uint)!bVar17;
      }
      if ((curmap->map_max <= sVar1) && (curmap = reallocmap(curmap), curmap == (KEYMAP *)0x0)) {
        return 0;
      }
      pmVar14 = ele;
      pp_Var5 = (PF *)calloc((long)(int)(((uint)bVar17 - c) + (int)ele->k_num),8);
      if (pp_Var5 == (PF *)0x0) goto LAB_0010f1c7;
      pmVar14->k_funcp[uVar9] = (PF)0x0;
      lVar13 = (long)ele->k_num - (long)ele->k_base;
      if ((int)(iVar11 + uVar8) <= (int)lVar13) {
        lVar15 = (long)(int)(iVar11 + uVar8) + -1;
        iVar11 = 0;
        do {
          pp_Var5[iVar11] = ele->k_funcp[lVar15 + 1];
          lVar15 = lVar15 + 1;
          iVar11 = iVar11 + 1;
        } while (lVar15 < lVar13);
      }
      sVar1 = curmap->map_num;
      for (pmVar14 = curmap->map_element + sVar1; ele < pmVar14; pmVar14 = pmVar14 + -1) {
        KVar3 = pmVar14[-1].k_num;
        pmVar14->k_base = pmVar14[-1].k_base;
        pmVar14->k_num = KVar3;
        pkVar6 = pmVar14[-1].k_prefmap;
        pmVar14->k_funcp = pmVar14[-1].k_funcp;
        pmVar14->k_prefmap = pkVar6;
      }
      ele->k_num = sVar12 - (ushort)bVar17;
      ele[1].k_base = (short)uVar8 + sVar12;
      ele[1].k_funcp = pp_Var5;
      ele = ele + bVar17;
      ele->k_prefmap = (keymap_s *)0x0;
      curmap->map_num = sVar1 + 1;
      if (pref_map != (KEYMAP *)0x0) {
        ele->k_prefmap = pref_map;
        return 1;
      }
      pkVar6 = (keymap_s *)malloc(0x70);
      if (pkVar6 != (keymap_s *)0x0) {
        pkVar6->map_num = 0;
        pkVar6->map_max = 4;
        pkVar6->map_default = rescan;
        ele->k_prefmap = pkVar6;
        return 1;
      }
      dobeep_msg("Out of memory");
      p_Var7 = curmap->map_default;
      pp_Var5 = ele->k_funcp;
      sVar1 = ele->k_base;
      goto LAB_0010f08e;
    }
    if (pp_Var5[uVar9] == (PF)0x0) {
      ele->k_prefmap = (keymap_s *)0x0;
    }
    pp_Var5[uVar9] = funct;
    if (funct != (PF)0x0) {
      return 1;
    }
    if (pref_map != (KEYMAP *)0x0) {
      ele->k_prefmap = pref_map;
      return 1;
    }
  }
  else {
    iVar11 = 1000;
    iVar16 = 1000;
    if ((curmap->map_element < ele) &&
       ((funct != (PF)0x0 || (ele[-1].k_prefmap == (keymap_s *)0x0)))) {
      iVar16 = c - ele[-1].k_num;
    }
    if ((ele < curmap->map_element + sVar1) &&
       ((funct != (PF)0x0 || (ele->k_prefmap == (keymap_s *)0x0)))) {
      iVar11 = ele->k_base - c;
    }
    if ((iVar16 < 5) && (iVar16 <= iVar11)) {
      sVar1 = ele[-1].k_base;
      ele = ele + -1;
      pp_Var5 = (PF *)calloc((long)((c - sVar1) + 1),8);
      if (pp_Var5 == (PF *)0x0) goto LAB_0010f1c7;
      sVar2 = pmVar14[-1].k_num;
      uVar9 = 0;
      if (sVar1 <= sVar2) {
        uVar9 = 0;
        do {
          pp_Var5[uVar9] = pmVar14[-1].k_funcp[uVar9];
          uVar9 = uVar9 + 1;
        } while (((int)sVar2 - (int)sVar1) + 1 != uVar9);
      }
      uVar8 = (uint)uVar9;
      if (iVar16 != 1) {
        p_Var7 = curmap->map_default;
        lVar13 = 0;
        do {
          pp_Var5[(uVar9 & 0xffffffff) + lVar13] = p_Var7;
          lVar13 = lVar13 + 1;
        } while (iVar16 + -1 != (int)lVar13);
        uVar8 = uVar8 + (int)lVar13;
      }
      pp_Var5[uVar8] = funct;
      pmVar14[-1].k_num = sVar12;
      pmVar14[-1].k_funcp = pp_Var5;
    }
    else if (iVar11 < 5) {
      sVar1 = ele->k_num;
      pp_Var5 = (PF *)calloc((long)((sVar1 - c) + 1),8);
      if (pp_Var5 == (PF *)0x0) {
LAB_0010f1c7:
        iVar11 = dobeep_msg("Out of memory");
        return iVar11;
      }
      sVar2 = pmVar14->k_base;
      if (sVar2 <= sVar1) {
        uVar9 = 0;
        do {
          pp_Var5[(long)iVar11 + uVar9] = pmVar14->k_funcp[uVar9];
          uVar9 = uVar9 + 1;
        } while (((int)sVar1 - (int)sVar2) + 1 != uVar9);
      }
      if (iVar11 + -1 != 0) {
        p_Var7 = curmap->map_default;
        lVar13 = (long)(iVar11 + -1);
        do {
          pp_Var5[lVar13] = p_Var7;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      *pp_Var5 = funct;
      pmVar14->k_base = sVar12;
      pmVar14->k_funcp = pp_Var5;
    }
    else {
      if ((curmap->map_max <= sVar1) && (curmap = reallocmap(curmap), curmap == (KEYMAP *)0x0)) {
        return 0;
      }
      pp_Var5 = (PF *)malloc(8);
      if (pp_Var5 == (PF *)0x0) goto LAB_0010f1c7;
      *pp_Var5 = funct;
      pmVar4 = ele;
      sVar1 = curmap->map_num;
      for (pmVar14 = curmap->map_element + sVar1; pmVar4 < pmVar14; pmVar14 = pmVar14 + -1) {
        KVar3 = pmVar14[-1].k_num;
        pmVar14->k_base = pmVar14[-1].k_base;
        pmVar14->k_num = KVar3;
        pkVar6 = pmVar14[-1].k_prefmap;
        pmVar14->k_funcp = pmVar14[-1].k_funcp;
        pmVar14->k_prefmap = pkVar6;
      }
      pmVar4->k_base = sVar12;
      pmVar4->k_num = sVar12;
      pmVar4->k_funcp = pp_Var5;
      pmVar4->k_prefmap = (keymap_s *)0x0;
      curmap->map_num = sVar1 + 1;
    }
    if (funct != (PF)0x0) {
      return 1;
    }
    if (pref_map != (KEYMAP *)0x0) {
      ele->k_prefmap = pref_map;
      return 1;
    }
  }
  pkVar6 = (keymap_s *)malloc(0x70);
  if (pkVar6 != (keymap_s *)0x0) {
    pkVar6->map_num = 0;
    pkVar6->map_max = 4;
    pkVar6->map_default = rescan;
    ele->k_prefmap = pkVar6;
    return 1;
  }
  dobeep_msg("Out of memory");
  p_Var7 = curmap->map_default;
  pp_Var5 = ele->k_funcp;
  sVar1 = ele->k_base;
LAB_0010f08e:
  pp_Var5[(long)c - (long)sVar1] = p_Var7;
  return 0;
}

Assistant:

static int
remap(KEYMAP *curmap, int c, PF funct, KEYMAP *pref_map)
{
	int		 i, n1, n2, nold;
	KEYMAP		*mp, *newmap;
	PF		*pfp;
	struct map_element	*mep;

	if (ele >= &curmap->map_element[curmap->map_num] || c < ele->k_base) {
		if (ele > &curmap->map_element[0] && (funct != NULL ||
		    (ele - 1)->k_prefmap == NULL))
			n1 = c - (ele - 1)->k_num;
		else
			n1 = HUGE;
		if (ele < &curmap->map_element[curmap->map_num] &&
		    (funct != NULL || ele->k_prefmap == NULL))
			n2 = ele->k_base - c;
		else
			n2 = HUGE;
		if (n1 <= MAPELEDEF && n1 <= n2) {
			ele--;
			if ((pfp = calloc(c - ele->k_base + 1,
			    sizeof(PF))) == NULL)
				return (dobeep_msg("Out of memory"));

			nold = ele->k_num - ele->k_base + 1;
			for (i = 0; i < nold; i++)
				pfp[i] = ele->k_funcp[i];
			while (--n1)
				pfp[i++] = curmap->map_default;
			pfp[i] = funct;
			ele->k_num = c;
			ele->k_funcp = pfp;
		} else if (n2 <= MAPELEDEF) {
			if ((pfp = calloc(ele->k_num - c + 1,
			    sizeof(PF))) == NULL)
				return (dobeep_msg("Out of memory"));

			nold = ele->k_num - ele->k_base + 1;
			for (i = 0; i < nold; i++)
				pfp[i + n2] = ele->k_funcp[i];
			while (--n2)
				pfp[n2] = curmap->map_default;
			pfp[0] = funct;
			ele->k_base = c;
			ele->k_funcp = pfp;
		} else {
			if (curmap->map_num >= curmap->map_max) {
				if ((newmap = reallocmap(curmap)) == NULL)
					return (FALSE);
				curmap = newmap;
			}
			if ((pfp = malloc(sizeof(PF))) == NULL)
				return (dobeep_msg("Out of memory"));

			pfp[0] = funct;
			for (mep = &curmap->map_element[curmap->map_num];
			    mep > ele; mep--) {
				mep->k_base = (mep - 1)->k_base;
				mep->k_num = (mep - 1)->k_num;
				mep->k_funcp = (mep - 1)->k_funcp;
				mep->k_prefmap = (mep - 1)->k_prefmap;
			}
			ele->k_base = c;
			ele->k_num = c;
			ele->k_funcp = pfp;
			ele->k_prefmap = NULL;
			curmap->map_num++;
		}
		if (funct == NULL) {
			if (pref_map != NULL)
				ele->k_prefmap = pref_map;
			else {
				if ((mp = malloc(sizeof(KEYMAP) +
				    (MAPINIT - 1) * sizeof(struct map_element))) == NULL) {
					(void)dobeep_msg("Out of memory");
					ele->k_funcp[c - ele->k_base] =
					    curmap->map_default;
					return (FALSE);
				}
				mp->map_num = 0;
				mp->map_max = MAPINIT;
				mp->map_default = rescan;
				ele->k_prefmap = mp;
			}
		}
	} else {
		n1 = c - ele->k_base;
		if (ele->k_funcp[n1] == funct && (funct != NULL ||
		    pref_map == NULL || pref_map == ele->k_prefmap))
			/* no change */
			return (TRUE);
		if (funct != NULL || ele->k_prefmap == NULL) {
			if (ele->k_funcp[n1] == NULL)
				ele->k_prefmap = NULL;
			/* easy case */
			ele->k_funcp[n1] = funct;
			if (funct == NULL) {
				if (pref_map != NULL)
					ele->k_prefmap = pref_map;
				else {
					if ((mp = malloc(sizeof(KEYMAP) +
					    (MAPINIT - 1) *
					    sizeof(struct map_element))) == NULL) {
						(void)dobeep_msg("Out of memory");
						ele->k_funcp[c - ele->k_base] =
						    curmap->map_default;
						return (FALSE);
					}
					mp->map_num = 0;
					mp->map_max = MAPINIT;
					mp->map_default = rescan;
					ele->k_prefmap = mp;
				}
			}
		} else {
			/*
			 * This case is the splits.
			 * Determine which side of the break c goes on
			 * 0 = after break; 1 = before break
			 */
			n2 = 1;
			for (i = 0; n2 && i < n1; i++)
				n2 &= ele->k_funcp[i] != NULL;
			if (curmap->map_num >= curmap->map_max) {
				if ((newmap = reallocmap(curmap)) == NULL)
					return (FALSE);
				curmap = newmap;
			}
			if ((pfp = calloc(ele->k_num - c + !n2,
			    sizeof(PF))) == NULL)
				return (dobeep_msg("Out of memory"));

			ele->k_funcp[n1] = NULL;
			for (i = n1 + n2; i <= ele->k_num - ele->k_base; i++)
				pfp[i - n1 - n2] = ele->k_funcp[i];
			for (mep = &curmap->map_element[curmap->map_num];
			    mep > ele; mep--) {
				mep->k_base = (mep - 1)->k_base;
				mep->k_num = (mep - 1)->k_num;
				mep->k_funcp = (mep - 1)->k_funcp;
				mep->k_prefmap = (mep - 1)->k_prefmap;
			}
			ele->k_num = c - !n2;
			(ele + 1)->k_base = c + n2;
			(ele + 1)->k_funcp = pfp;
			ele += !n2;
			ele->k_prefmap = NULL;
			curmap->map_num++;
			if (pref_map == NULL) {
				if ((mp = malloc(sizeof(KEYMAP) + (MAPINIT - 1)
				    * sizeof(struct map_element))) == NULL) {
					(void)dobeep_msg("Out of memory");
					ele->k_funcp[c - ele->k_base] =
					    curmap->map_default;
					return (FALSE);
				}
				mp->map_num = 0;
				mp->map_max = MAPINIT;
				mp->map_default = rescan;
				ele->k_prefmap = mp;
			} else
				ele->k_prefmap = pref_map;
		}
	}
	return (TRUE);
}